

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_ocaml_generator.cc
# Opt level: O1

void __thiscall t_ocaml_generator::generate_typedef(t_ocaml_generator *this,t_typedef *ttypedef)

{
  pointer pcVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  ostream *poVar5;
  t_type *ptVar6;
  char *local_d0;
  char local_c0 [8];
  undefined8 uStack_b8;
  char *local_b0;
  long local_a8;
  char local_a0 [8];
  undefined8 uStack_98;
  char *local_90;
  long local_88;
  char local_80 [8];
  undefined8 uStack_78;
  string local_70;
  string local_50;
  
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_,local_50._M_dataplus._M_p,local_50._M_string_length
                     );
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"type ",5);
  pcVar1 = (ttypedef->symbolic_)._M_dataplus._M_p;
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,pcVar1,pcVar1 + (ttypedef->symbolic_)._M_string_length);
  pcVar2 = local_90;
  iVar4 = tolower((int)*local_90);
  *pcVar2 = (char)iVar4;
  lVar3 = local_88;
  if (local_90 == local_80) {
    uStack_b8 = uStack_78;
    local_d0 = local_c0;
  }
  else {
    local_d0 = local_90;
  }
  local_88 = 0;
  local_80[0] = '\0';
  local_90 = local_80;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  ptVar6 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&local_70,this,ptVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_i_,local_50._M_dataplus._M_p,
                      local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"type ",5);
  pcVar1 = (ttypedef->symbolic_)._M_dataplus._M_p;
  local_b0 = local_a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,pcVar1,pcVar1 + (ttypedef->symbolic_)._M_string_length);
  pcVar2 = local_b0;
  iVar4 = tolower((int)*local_b0);
  *pcVar2 = (char)iVar4;
  lVar3 = local_a8;
  if (local_b0 == local_a0) {
    uStack_b8 = uStack_98;
    local_d0 = local_c0;
  }
  else {
    local_d0 = local_b0;
  }
  local_a8 = 0;
  local_a0[0] = '\0';
  local_b0 = local_a0;
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_d0,lVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = ",3);
  ptVar6 = t_typedef::get_type(ttypedef);
  render_ocaml_type_abi_cxx11_(&local_70,this,ptVar6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_70._M_dataplus._M_p,local_70._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_b0 != local_a0) {
    operator_delete(local_b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_ocaml_generator::generate_typedef(t_typedef* ttypedef) {
  f_types_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
           << render_ocaml_type(ttypedef->get_type()) << endl << endl;
  f_types_i_ << indent() << "type " << decapitalize(ttypedef->get_symbolic()) << " = "
             << render_ocaml_type(ttypedef->get_type()) << endl << endl;
}